

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void setSectorSize(Pager *pPager)

{
  _func_int_sqlite3_file_ptr *p_Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0x200;
  if ((pPager->tempFile == '\0') &&
     (uVar2 = (*pPager->fd->pMethods->xDeviceCharacteristics)(pPager->fd), (uVar2 >> 0xc & 1) == 0))
  {
    p_Var1 = pPager->fd->pMethods->xSectorSize;
    if (p_Var1 == (_func_int_sqlite3_file_ptr *)0x0) {
      uVar4 = 0x1000;
    }
    else {
      uVar3 = (*p_Var1)(pPager->fd);
      uVar2 = 0x10000;
      if (uVar3 < 0x10000) {
        uVar2 = uVar3;
      }
      uVar4 = 0x200;
      if (0x1f < (int)uVar3) {
        uVar4 = uVar2;
      }
    }
  }
  pPager->sectorSize = uVar4;
  return;
}

Assistant:

static void setSectorSize(Pager *pPager){
  assert( isOpen(pPager->fd) || pPager->tempFile );

  if( pPager->tempFile
   || (sqlite3OsDeviceCharacteristics(pPager->fd) &
              SQLITE_IOCAP_POWERSAFE_OVERWRITE)!=0
  ){
    /* Sector size doesn't matter for temporary files. Also, the file
    ** may not have been opened yet, in which case the OsSectorSize()
    ** call will segfault. */
    pPager->sectorSize = 512;
  }else{
    pPager->sectorSize = sqlite3SectorSize(pPager->fd);
  }
}